

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-common.cc
# Opt level: O2

string * __thiscall
cnn::PickNegLogSoftmax::as_string
          (string *__return_storage_ptr__,PickNegLogSoftmax *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arg_names)

{
  pointer puVar1;
  ostream *poVar2;
  pointer puVar3;
  allocator local_1d1;
  string *local_1d0;
  string sep;
  ostringstream s;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&s);
  if (this->pval == (uint *)0x0) {
    poVar2 = std::operator<<((ostream *)&s,"log_softmax(");
    poVar2 = std::operator<<(poVar2,(string *)
                                    (arg_names->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start);
    std::operator<<(poVar2,")_{");
    local_1d0 = __return_storage_ptr__;
    std::__cxx11::string::string((string *)&sep,"",&local_1d1);
    puVar1 = (this->pvals->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (puVar3 = (this->pvals->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                  _M_impl.super__Vector_impl_data._M_start; puVar3 != puVar1; puVar3 = puVar3 + 1) {
      poVar2 = std::operator<<((ostream *)&s,(string *)&sep);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::__cxx11::string::assign((char *)&sep);
    }
    std::operator<<((ostream *)&s,'}');
    std::__cxx11::string::~string((string *)&sep);
    __return_storage_ptr__ = local_1d0;
  }
  else {
    poVar2 = std::operator<<((ostream *)&s,"log_softmax(");
    poVar2 = std::operator<<(poVar2,(string *)
                                    (arg_names->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start);
    poVar2 = std::operator<<(poVar2,")_{");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::operator<<(poVar2,'}');
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&s);
  return __return_storage_ptr__;
}

Assistant:

string PickNegLogSoftmax::as_string(const vector<string>& arg_names) const {
  ostringstream s;
  if(pval) {
    s << "log_softmax(" << arg_names[0] << ")_{" << *pval << '}';
  } else {
    s << "log_softmax(" << arg_names[0] << ")_{";
    string sep = "";
    for(auto v : *pvals) { s << sep << v; sep = ","; }
    s << '}';
  }
  return s.str();
}